

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O1

int qc_list_inserttail2(QcList *list,void *data,QcListEntry **pp_entry)

{
  uint *puVar1;
  QcListEntry *pQVar2;
  QcListEntry *pQVar3;
  QcList *pQVar4;
  int iVar5;
  QcList *pQVar6;
  
  if (list == (QcList *)0x0) {
    qc_list_inserttail2_cold_3();
    pQVar6 = list;
  }
  else {
    pQVar6 = list;
    if (data != (void *)0x0) {
      pQVar6 = (QcList *)0x18;
      pQVar3 = (QcListEntry *)malloc(0x18);
      if (pQVar3 != (QcListEntry *)0x0) {
        pQVar3->next = (QcListEntry *)0x0;
        pQVar3->prev = (QcListEntry *)0x0;
        pQVar3->data = data;
        pQVar3->next = (QcListEntry *)0x0;
        pQVar6 = (QcList *)list->tail;
        pQVar3->prev = (QcListEntry *)pQVar6;
        if (pQVar6 == (QcList *)0x0) {
          pQVar6 = list;
        }
        pQVar6->head = pQVar3;
        list->tail = pQVar3;
        list->count = list->count + 1;
        *pp_entry = pQVar3;
        return 0;
      }
      goto LAB_00109058;
    }
  }
  qc_list_inserttail2_cold_2();
LAB_00109058:
  qc_list_inserttail2_cold_1();
  if (pQVar6 != (QcList *)0x0) {
    pQVar3 = pQVar6->head;
    if (pQVar3 == (QcListEntry *)0x0) {
      iVar5 = 0;
    }
    else {
      if (pQVar6->cur == pQVar3) {
        pQVar6->cur = pQVar3->next;
      }
      pQVar2 = pQVar3->next;
      pQVar6->head = pQVar2;
      if (pQVar2 != (QcListEntry *)0x0) {
        pQVar2->prev = (QcListEntry *)0x0;
      }
      puVar1 = &pQVar6->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        pQVar6->tail = (QcListEntry *)0x0;
      }
      iVar5 = (int)pQVar3->data;
      free(pQVar3);
    }
    return iVar5;
  }
  qc_list_pophead_cold_1();
  if (pQVar6 != (QcList *)0x0) {
    if (pQVar6->head == (QcListEntry *)0x0) {
      iVar5 = 0;
    }
    else {
      pQVar3 = pQVar6->tail;
      if (pQVar6->cur == pQVar3) {
        pQVar6->cur = (QcListEntry *)0x0;
      }
      pQVar4 = pQVar6;
      if (pQVar3 != pQVar6->head) {
        pQVar4 = (QcList *)pQVar3->prev;
      }
      pQVar4->head = (QcListEntry *)0x0;
      pQVar6->tail = pQVar3->prev;
      pQVar6->count = pQVar6->count - 1;
      iVar5 = (int)pQVar3->data;
      free(pQVar3);
    }
    return iVar5;
  }
  qc_list_poptail_cold_1();
  pQVar6->cur = pQVar6->head;
  return (int)pQVar6->head;
}

Assistant:

int qc_list_inserttail2(QcList *list, void *data, QcListEntry **pp_entry)
{
    QcListEntry *entry;

    qc_assert(list);
    qc_assert(data);

    qc_malloc(entry, sizeof(struct __QcListEntry));
    if(!entry)
    {
        *pp_entry = NULL;
        return -1;
    }

    entry->data = data;
    entry->next = NULL;

    entry->prev = list->tail;

    if(!list->tail)
    {
        list->head = entry;
    }
    else
    {
        list->tail->next = entry;
    }

    list->tail = entry;
    list->count++;
    *pp_entry  = entry;
    
    return 0;
}